

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  int iVar1;
  int iVar2;
  ImFontGlyph *pIVar3;
  ImFontAtlas *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  ImFontGlyph *__dest;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar13 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar17 [64];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar18 [64];
  float advance_x_original;
  undefined1 in_register_00001504 [12];
  
  auVar18._4_60_ = in_register_000012c4;
  auVar18._0_4_ = y1;
  auVar17._4_60_ = in_register_00001284;
  auVar17._0_4_ = x1;
  auVar12 = auVar17._0_16_;
  auVar14._4_60_ = in_register_00001244;
  auVar14._0_4_ = y0;
  auVar13._4_60_ = in_register_00001204;
  auVar13._0_4_ = x0;
  auVar15 = auVar13._0_16_;
  if (cfg != (ImFontConfig *)0x0) {
    auVar16 = vminss_avx(ZEXT416((uint)cfg->GlyphMaxAdvanceX),ZEXT416((uint)advance_x));
    uVar6 = vcmpss_avx512f(ZEXT416((uint)advance_x),ZEXT416((uint)cfg->GlyphMinAdvanceX),1);
    bVar7 = (bool)((byte)uVar6 & 1);
    fVar10 = (float)((uint)bVar7 * (int)cfg->GlyphMinAdvanceX + (uint)!bVar7 * auVar16._0_4_);
    if ((fVar10 != advance_x) || (NAN(fVar10) || NAN(advance_x))) {
      fVar11 = (fVar10 - advance_x) * 0.5;
      auVar15 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar11));
      fVar11 = (float)((uint)(cfg->PixelSnapH & 1) * auVar15._0_4_ +
                      (uint)!(bool)(cfg->PixelSnapH & 1) * (int)fVar11);
      auVar15 = ZEXT416((uint)(fVar11 + x0));
      auVar12 = ZEXT416((uint)(fVar11 + x1));
    }
    auVar16 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar10 + 0.5)));
    advance_x = (float)((uint)(cfg->PixelSnapH & 1) * auVar16._0_4_ +
                       (uint)!(bool)(cfg->PixelSnapH & 1) * (int)fVar10) +
                (cfg->GlyphExtraSpacing).x;
  }
  iVar1 = (this->Glyphs).Size;
  iVar9 = iVar1 + 1;
  iVar2 = (this->Glyphs).Capacity;
  if (iVar2 <= iVar1) {
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar8 <= iVar9) {
      iVar8 = iVar9;
    }
    if (iVar2 < iVar8) {
      __dest = (ImFontGlyph *)ImGui::MemAlloc((long)iVar8 * 0x28);
      pIVar3 = (this->Glyphs).Data;
      if (pIVar3 != (ImFontGlyph *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->Glyphs).Size * 0x28);
        ImGui::MemFree((this->Glyphs).Data);
      }
      (this->Glyphs).Data = __dest;
      (this->Glyphs).Capacity = iVar8;
    }
  }
  (this->Glyphs).Size = iVar9;
  pIVar3 = (this->Glyphs).Data;
  uVar6 = vcmpps_avx512vl(auVar14._0_16_,auVar18._0_16_,4);
  uVar5 = vcmpps_avx512vl(auVar15,auVar12,4);
  *(uint *)(pIVar3 + iVar1) = (uint)codepoint * 4 + ((uint)uVar6 & (uint)uVar5 & 1) * 2;
  pIVar3[iVar1].X0 = auVar15._0_4_;
  pIVar3[iVar1].Y0 = y0;
  pIVar3[iVar1].X1 = auVar12._0_4_;
  pIVar3[iVar1].Y1 = y1;
  pIVar3[iVar1].U0 = u0;
  pIVar3[iVar1].V0 = v0;
  pIVar3[iVar1].U1 = u1;
  pIVar3[iVar1].V1 = v1;
  pIVar3[iVar1].AdvanceX = advance_x;
  pIVar4 = this->ContainerAtlas;
  iVar1 = pIVar4->TexGlyphPadding;
  this->DirtyLookupTables = true;
  auVar15._0_4_ = (float)pIVar4->TexWidth;
  auVar15._4_12_ = in_register_00001504;
  auVar12 = ZEXT416((uint)((float)iVar1 + 0.99));
  auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)(u1 - u0)),auVar12);
  auVar16._0_4_ = (float)pIVar4->TexHeight;
  auVar16._4_12_ = in_register_00001504;
  auVar12 = vfmadd213ss_fma(auVar16,ZEXT416((uint)(v1 - v0)),auVar12);
  this->MetricsTotalSurface = this->MetricsTotalSurface + (int)auVar12._0_4_ * (int)auVar15._0_4_;
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}